

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_sort(secp256k1_context *ctx,secp256k1_pubkey **pubkeys,size_t n_pubkeys)

{
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_pubkey_sort_cold_2();
  }
  else if (pubkeys != (secp256k1_pubkey **)0x0) {
    secp256k1_hsort(pubkeys,n_pubkeys,8,secp256k1_ec_pubkey_sort_cmp,ctx);
    return 1;
  }
  secp256k1_ec_pubkey_sort_cold_1();
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_sort(const secp256k1_context* ctx, const secp256k1_pubkey **pubkeys, size_t n_pubkeys) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);

    /* Suppress wrong warning (fixed in MSVC 19.33) */
    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(push)
    #pragma warning(disable: 4090)
    #endif

    /* Casting away const is fine because neither secp256k1_hsort nor
     * secp256k1_ec_pubkey_sort_cmp modify the data pointed to by the cmp_data
     * argument. */
    secp256k1_hsort(pubkeys, n_pubkeys, sizeof(*pubkeys), secp256k1_ec_pubkey_sort_cmp, (void *)ctx);

    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(pop)
    #endif

    return 1;
}